

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

PromiseType
QtPromise::map<QList<int>,tst_qpromise_map::modifyValues()::__0>
          (QtPromise *values,QList<int> *param_2)

{
  bool bVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> extraout_RDX;
  PromiseType PVar2;
  anon_class_24_3_1e033230 local_90;
  QPromise<int> local_78;
  int *local_68;
  int *v;
  const_iterator local_58;
  const_iterator __end0;
  const_iterator __begin0;
  QList<int> *__range2;
  vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> promises;
  int i;
  QList<int> *values_local;
  QtPromise *local_10;
  
  promises.super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_10 = values;
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::vector
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
             &__range2);
  __end0 = QList<int>::begin(param_2);
  local_58 = QList<int>::end(param_2);
  while( true ) {
    v = local_58.i;
    bVar1 = QList<int>::const_iterator::operator!=(&__end0,local_58);
    if (!bVar1) break;
    local_90.v = QList<int>::const_iterator::operator*(&__end0);
    local_90.fn = (anon_class_1_0_00000001_for_fn *)((long)&values_local + 7);
    local_90.i = (int *)((long)&promises.
                                super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    local_68 = local_90.v;
    QPromise<int>::
    QPromise<QtPromise::map<QList<int>,tst_qpromise_map::modifyValues()::__0>(QList<int>const&,tst_qpromise_map::modifyValues()::__0)::_lambda(QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)_1_>
              (&local_78,&local_90);
    std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::push_back
              ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
               &__range2,&local_78);
    QPromise<int>::~QPromise(&local_78);
    promises.
    super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ =
         promises.
         super__Vector_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    QList<int>::const_iterator::operator++(&__end0);
  }
  all<int,_std::vector,_std::allocator<QtPromise::QPromise<int>_>_>
            (values,(vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
                    &__range2);
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::~vector
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)
             &__range2);
  PVar2.super_QPromiseBase<QList<int>_>.m_d.d = extraout_RDX.d;
  PVar2.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)values;
  return (PromiseType)PVar2.super_QPromiseBase<QList<int>_>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseMapper<Sequence, Functor>::PromiseType
map(const Sequence& values, Functor fn)
{
    using namespace QtPromisePrivate;
    using MapperType = PromiseMapper<Sequence, Functor>;
    using ResType = typename MapperType::ResultType::value_type;
    using RetType = typename MapperType::ReturnType;

    int i = 0;

    std::vector<QPromise<ResType>> promises;
    for (const auto& v : values) {
        promises.push_back(QPromise<ResType>{
            [&](const QPromiseResolve<ResType>& resolve, const QPromiseReject<ResType>& reject) {
                PromiseFulfill<RetType>::call(fn(v, i), resolve, reject);
            }});

        i++;
    }

    return QtPromise::all(promises);
}